

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

void __thiscall ctemplate::TemplateCache::Freeze(TemplateCache *this)

{
  bool bVar1;
  Mutex *pMVar2;
  
  pMVar2 = this->mutex_;
  Mutex::ReaderLock(pMVar2);
  bVar1 = this->is_frozen_;
  Mutex::ReaderUnlock(pMVar2);
  if (bVar1 != false) {
    return;
  }
  ReloadAllIfChanged(this,IMMEDIATE_RELOAD);
  pMVar2 = this->mutex_;
  Mutex::Lock(pMVar2);
  this->is_frozen_ = true;
  Mutex::Unlock(pMVar2);
  return;
}

Assistant:

void TemplateCache::Freeze() {
  {
    ReaderMutexLock ml(mutex_);
    if (is_frozen_) {  // if already frozen, then this is a no-op.
      return;
    }
  }
  // A final reload before freezing the cache.
  ReloadAllIfChanged(IMMEDIATE_RELOAD);
  {
    WriterMutexLock ml(mutex_);
    is_frozen_ = true;
  }
}